

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

bool wabt::anon_unknown_0::func_uses_simd(FuncSignature *sig)

{
  pointer pTVar1;
  pointer pTVar2;
  pointer pTVar3;
  long lVar4;
  
  pTVar3 = (sig->param_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (sig->param_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = (long)pTVar1 - (long)pTVar3 >> 5;
  pTVar2 = pTVar3;
  if (0 < lVar4) {
    pTVar2 = (pointer)((long)&pTVar3->enum_ + ((long)pTVar1 - (long)pTVar3 & 0xffffffffffffffe0U));
    lVar4 = lVar4 + 1;
    pTVar3 = pTVar3 + 2;
    do {
      if (pTVar3[-2].enum_ == V128) {
        pTVar3 = pTVar3 + -2;
        goto LAB_00145db4;
      }
      if (pTVar3[-1].enum_ == V128) {
        pTVar3 = pTVar3 + -1;
        goto LAB_00145db4;
      }
      if (pTVar3->enum_ == V128) goto LAB_00145db4;
      if (pTVar3[1].enum_ == V128) {
        pTVar3 = pTVar3 + 1;
        goto LAB_00145db4;
      }
      lVar4 = lVar4 + -1;
      pTVar3 = pTVar3 + 4;
    } while (1 < lVar4);
  }
  lVar4 = (long)pTVar1 - (long)pTVar2 >> 3;
  if (lVar4 == 1) {
LAB_00145d99:
    pTVar3 = pTVar2;
    if (pTVar2->enum_ != V128) {
      pTVar3 = pTVar1;
    }
  }
  else if (lVar4 == 2) {
LAB_00145d91:
    pTVar3 = pTVar2;
    if (pTVar2->enum_ != V128) {
      pTVar2 = pTVar2 + 1;
      goto LAB_00145d99;
    }
  }
  else {
    pTVar3 = pTVar1;
    if ((lVar4 == 3) && (pTVar3 = pTVar2, pTVar2->enum_ != V128)) {
      pTVar2 = pTVar2 + 1;
      goto LAB_00145d91;
    }
  }
LAB_00145db4:
  if (pTVar3 != pTVar1) {
    return true;
  }
  pTVar3 = (sig->result_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (sig->result_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = (long)pTVar1 - (long)pTVar3 >> 5;
  pTVar2 = pTVar3;
  if (0 < lVar4) {
    pTVar2 = (pointer)((long)&pTVar3->enum_ + ((long)pTVar1 - (long)pTVar3 & 0xffffffffffffffe0U));
    lVar4 = lVar4 + 1;
    pTVar3 = pTVar3 + 2;
    do {
      if (pTVar3[-2].enum_ == V128) {
        pTVar3 = pTVar3 + -2;
        goto LAB_00145e54;
      }
      if (pTVar3[-1].enum_ == V128) {
        pTVar3 = pTVar3 + -1;
        goto LAB_00145e54;
      }
      if (pTVar3->enum_ == V128) goto LAB_00145e54;
      if (pTVar3[1].enum_ == V128) {
        pTVar3 = pTVar3 + 1;
        goto LAB_00145e54;
      }
      lVar4 = lVar4 + -1;
      pTVar3 = pTVar3 + 4;
    } while (1 < lVar4);
  }
  lVar4 = (long)pTVar1 - (long)pTVar2 >> 3;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pTVar3 = pTVar1;
      if ((lVar4 != 3) || (pTVar3 = pTVar2, pTVar2->enum_ == V128)) goto LAB_00145e54;
      pTVar2 = pTVar2 + 1;
    }
    pTVar3 = pTVar2;
    if (pTVar2->enum_ == V128) goto LAB_00145e54;
    pTVar2 = pTVar2 + 1;
  }
  pTVar3 = pTVar2;
  if (pTVar2->enum_ != V128) {
    pTVar3 = pTVar1;
  }
LAB_00145e54:
  return pTVar3 != pTVar1;
}

Assistant:

static bool func_uses_simd(const FuncSignature& sig) {
  return std::any_of(sig.param_types.begin(), sig.param_types.end(),
                     [](auto x) { return x == Type::V128; }) ||
         std::any_of(sig.result_types.begin(), sig.result_types.end(),
                     [](auto x) { return x == Type::V128; });
}